

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_opc_mxu__pool13(CPUMIPSState_conflict2 *env,DisasContext_conflict4 *ctx)

{
  uint32_t uVar1;
  uint32_t opcode;
  DisasContext_conflict4 *ctx_local;
  CPUMIPSState_conflict2 *env_local;
  
  uVar1 = extract32(ctx->opcode,0x16,2);
  if (uVar1 == 0) {
    generate_exception_end(ctx,0x14);
  }
  else if (uVar1 == 1) {
    generate_exception_end(ctx,0x14);
  }
  else if (uVar1 == 2) {
    generate_exception_end(ctx,0x14);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void decode_opc_mxu__pool13(CPUMIPSState *env, DisasContext *ctx)
{
    uint32_t opcode = extract32(ctx->opcode, 22, 2);

    switch (opcode) {
    case OPC_MXU_Q16ACC:
        /* TODO: Implement emulation of Q16ACC instruction. */
        MIPS_INVAL("OPC_MXU_Q16ACC");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16ACCM:
        /* TODO: Implement emulation of Q16ACCM instruction. */
        MIPS_INVAL("OPC_MXU_Q16ACCM");
        generate_exception_end(ctx, EXCP_RI);
        break;
    case OPC_MXU_Q16ASUM:
        /* TODO: Implement emulation of Q16ASUM instruction. */
        MIPS_INVAL("OPC_MXU_Q16ASUM");
        generate_exception_end(ctx, EXCP_RI);
        break;
    default:
        MIPS_INVAL("decode_opc_mxu");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}